

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void Prn_gen<Blob<160>>(int nbRn,pfHash hash,vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  uint uVar1;
  bool bVar2;
  Blob<160> hcopy;
  Blob<160> h;
  
  printf("Generating %i random numbers : \n",nbRn);
  Blob<160>::Blob(&hcopy);
  hcopy.bytes[0x10] = '\0';
  hcopy.bytes[0x11] = '\0';
  hcopy.bytes[0x12] = '\0';
  hcopy.bytes[0x13] = '\0';
  uVar1 = ~(nbRn >> 0x1f) & nbRn;
  hcopy.bytes[0] = '\0';
  hcopy.bytes[1] = '\0';
  hcopy.bytes[2] = '\0';
  hcopy.bytes[3] = '\0';
  hcopy.bytes[4] = '\0';
  hcopy.bytes[5] = '\0';
  hcopy.bytes[6] = '\0';
  hcopy.bytes[7] = '\0';
  hcopy.bytes[8] = '\0';
  hcopy.bytes[9] = '\0';
  hcopy.bytes[10] = '\0';
  hcopy.bytes[0xb] = '\0';
  hcopy.bytes[0xc] = '\0';
  hcopy.bytes[0xd] = '\0';
  hcopy.bytes[0xe] = '\0';
  hcopy.bytes[0xf] = '\0';
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    Blob<160>::Blob(&h);
    (*hash)(&hcopy,0x14,0,&h);
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(hashes,&h);
    hcopy.bytes[0] = h.bytes[0];
    hcopy.bytes[1] = h.bytes[1];
    hcopy.bytes[2] = h.bytes[2];
    hcopy.bytes[3] = h.bytes[3];
    hcopy.bytes[4] = h.bytes[4];
    hcopy.bytes[5] = h.bytes[5];
    hcopy.bytes[6] = h.bytes[6];
    hcopy.bytes[7] = h.bytes[7];
    hcopy.bytes[8] = h.bytes[8];
    hcopy.bytes[9] = h.bytes[9];
    hcopy.bytes[10] = h.bytes[10];
    hcopy.bytes[0xb] = h.bytes[0xb];
    hcopy.bytes[0xc] = h.bytes[0xc];
    hcopy.bytes[0xd] = h.bytes[0xd];
    hcopy.bytes[0xe] = h.bytes[0xe];
    hcopy.bytes[0xf] = h.bytes[0xf];
    hcopy.bytes[0x10] = h.bytes[0x10];
    hcopy.bytes[0x11] = h.bytes[0x11];
    hcopy.bytes[0x12] = h.bytes[0x12];
    hcopy.bytes[0x13] = h.bytes[0x13];
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}